

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O2

IceTBoolean strategy_uses_single_image_strategy(IceTEnum strategy)

{
  if (strategy - 0x6001 < 5) {
    return (IceTBoolean)(0x1000100L >> ((char)(strategy - 0x6001) * '\b' & 0x3fU));
  }
  printf("ERROR: unknown strategy type.");
  return '\x01';
}

Assistant:

IceTBoolean strategy_uses_single_image_strategy(IceTEnum strategy)
{
    switch (strategy) {
      case ICET_STRATEGY_DIRECT:        return ICET_FALSE;
      case ICET_STRATEGY_SEQUENTIAL:    return ICET_TRUE;
      case ICET_STRATEGY_SPLIT:         return ICET_FALSE;
      case ICET_STRATEGY_REDUCE:        return ICET_TRUE;
      case ICET_STRATEGY_VTREE:         return ICET_FALSE;
      default:
          printf("ERROR: unknown strategy type.");
          return ICET_TRUE;
    }
}